

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O0

void multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  uchar c_00;
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  size_t N_00;
  size_t N_01;
  size_t N_02;
  size_t bucketsize2;
  size_t bucketsize1;
  size_t bucketsize0;
  uint b_1;
  uint uStack_e0;
  uchar c;
  uint b;
  uint j_1;
  uint j;
  array<unsigned_char,_32UL> cache;
  size_t i;
  undefined1 local_98 [7];
  uchar partval;
  array<vector_bagwell<unsigned_char_*,_16U>,_3UL> buckets;
  size_t depth_local;
  size_t N_local;
  uchar **strings_local;
  
  buckets._M_elems[2]._left_in_block = depth;
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
  }
  else {
    std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::array
              ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98);
    c_00 = pseudo_median<unsigned_char>(strings,N,buckets._M_elems[2]._left_in_block);
    cache._M_elems[0x18] = '\0';
    cache._M_elems[0x19] = '\0';
    cache._M_elems[0x1a] = '\0';
    cache._M_elems[0x1b] = '\0';
    cache._M_elems[0x1c] = '\0';
    cache._M_elems[0x1d] = '\0';
    cache._M_elems[0x1e] = '\0';
    cache._M_elems[0x1f] = '\0';
    for (; (ulong)cache._M_elems._24_8_ < N - (N & 0x1f);
        cache._M_elems._24_8_ = cache._M_elems._24_8_ + 0x20) {
      for (b = 0; b < 0x20; b = b + 1) {
        uVar1 = get_char<unsigned_char>
                          (strings[cache._M_elems._24_8_ + (ulong)b],
                           buckets._M_elems[2]._left_in_block);
        pvVar4 = std::array<unsigned_char,_32UL>::operator[]
                           ((array<unsigned_char,_32UL> *)&j_1,(ulong)b);
        *pvVar4 = uVar1;
      }
      for (uStack_e0 = 0; uStack_e0 < 0x20; uStack_e0 = uStack_e0 + 1) {
        pvVar4 = std::array<unsigned_char,_32UL>::operator[]
                           ((array<unsigned_char,_32UL> *)&j_1,(ulong)uStack_e0);
        uVar3 = get_bucket<unsigned_char>(*pvVar4,c_00);
        pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                           ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,
                            (ulong)uVar3);
        vector_bagwell<unsigned_char_*,_16U>::push_back
                  (pvVar5,strings + cache._M_elems._24_8_ + (ulong)uStack_e0);
      }
    }
    for (; (ulong)cache._M_elems._24_8_ < N; cache._M_elems._24_8_ = cache._M_elems._24_8_ + 1) {
      uVar1 = get_char<unsigned_char>
                        (strings[cache._M_elems._24_8_],buckets._M_elems[2]._left_in_block);
      uVar3 = get_bucket<unsigned_char>(uVar1,c_00);
      pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                         ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,(ulong)uVar3)
      ;
      vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar5,strings + cache._M_elems._24_8_);
    }
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,0);
    N_00 = vector_bagwell<unsigned_char_*,_16U>::size(pvVar5);
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,1);
    N_01 = vector_bagwell<unsigned_char_*,_16U>::size(pvVar5);
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,2);
    N_02 = vector_bagwell<unsigned_char_*,_16U>::size(pvVar5);
    if (N_00 + N_01 + N_02 != N) {
      __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                    ,0x5d,
                    "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_bagwell<unsigned char *>, CharT = unsigned char]"
                   );
    }
    if (N_00 != 0) {
      pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                         ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,0);
      copy<unsigned_char*,16u,unsigned_char**>(pvVar5,strings);
    }
    if (N_01 != 0) {
      pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                         ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,1);
      copy<unsigned_char*,16u,unsigned_char**>(pvVar5,strings + N_00);
    }
    if (N_02 != 0) {
      pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                         ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,2);
      copy<unsigned_char*,16u,unsigned_char**>(pvVar5,strings + N_00 + N_01);
    }
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,0);
    clear_bucket<vector_bagwell<unsigned_char*,16u>>(pvVar5);
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,1);
    clear_bucket<vector_bagwell<unsigned_char*,16u>>(pvVar5);
    pvVar5 = std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::operator[]
                       ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98,2);
    clear_bucket<vector_bagwell<unsigned_char*,16u>>(pvVar5);
    multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
              (strings,N_00,buckets._M_elems[2]._left_in_block);
    bVar2 = is_end<unsigned_char>(c_00);
    if (!bVar2) {
      multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
                (strings + N_00,N_01,buckets._M_elems[2]._left_in_block + 1);
    }
    multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_char>
              (strings + N_00 + N_01,N_02,buckets._M_elems[2]._left_in_block);
    std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::~array
              ((array<vector_bagwell<unsigned_char_*,_16U>,_3UL> *)local_98);
  }
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}